

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_avx2.c
# Opt level: O2

void cdef_copy_rect8_8bit_to_16bit_avx2
               (uint16_t *dst,int dstride,uint8_t *src,int sstride,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  undefined1 (*pauVar8) [16];
  ulong *puVar9;
  uint *puVar10;
  long lVar11;
  uint16_t *puVar12;
  uint8_t *puVar13;
  uint uVar14;
  undefined1 (*pauVar15) [32];
  uint16_t *puVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  int k;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  uint8_t *puVar24;
  
  uVar22 = 0;
  lVar19 = (long)height;
  lVar17 = (long)sstride;
  lVar11 = (long)dstride;
  uVar14 = width;
  if (0x1f < width) {
    puVar12 = dst + lVar11 + 0x10;
    puVar16 = dst + 0x10;
    puVar24 = src + lVar17 + 0x10;
    puVar13 = src + 0x10;
    lVar7 = 0;
    do {
      uVar22 = 0;
      do {
        auVar3 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar13 + (uVar22 - 0x10)));
        auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar13 + uVar22));
        auVar5 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar24 + (uVar22 - 0x10)));
        auVar6 = vpmovzxbw_avx2(*(undefined1 (*) [16])(puVar24 + uVar22));
        *(undefined1 (*) [32])(puVar16 + (uVar22 - 0x10)) = auVar3;
        *(undefined1 (*) [32])(puVar16 + uVar22) = auVar4;
        *(undefined1 (*) [32])(puVar12 + (uVar22 - 0x10)) = auVar5;
        *(undefined1 (*) [32])(puVar12 + uVar22) = auVar6;
        uVar22 = uVar22 + 0x20;
      } while (uVar22 <= width - 0x20);
      lVar7 = lVar7 + 2;
      puVar12 = puVar12 + lVar11 * 2;
      puVar16 = puVar16 + lVar11 * 2;
      puVar24 = puVar24 + lVar17 * 2;
      puVar13 = puVar13 + lVar17 * 2;
    } while (lVar7 < lVar19);
    uVar14 = width & 0x1f;
  }
  if (0xf < (int)uVar14) {
    iVar21 = (int)uVar22;
    pauVar8 = (undefined1 (*) [16])(src + iVar21);
    pauVar15 = (undefined1 (*) [32])(dst + iVar21);
    lVar7 = 0;
    do {
      auVar3 = vpmovzxbw_avx2(*pauVar8);
      auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*pauVar8 + lVar17));
      *pauVar15 = auVar3;
      *(undefined1 (*) [32])(*pauVar15 + lVar11 * 2) = auVar4;
      lVar7 = lVar7 + 2;
      pauVar8 = (undefined1 (*) [16])(*pauVar8 + lVar17 * 2);
      pauVar15 = (undefined1 (*) [32])(*pauVar15 + lVar11 * 4);
    } while (lVar7 < lVar19);
    uVar14 = width & 0xf;
    uVar22 = (ulong)(iVar21 + 0x10);
  }
  if (7 < (int)uVar14) {
    iVar21 = (int)uVar22;
    puVar9 = (ulong *)(src + iVar21);
    pauVar8 = (undefined1 (*) [16])(dst + iVar21);
    lVar7 = 0;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *puVar9;
      auVar1 = vpmovzxbw_avx(auVar1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)((long)puVar9 + lVar17);
      auVar2 = vpmovzxbw_avx(auVar2);
      *pauVar8 = auVar1;
      *(undefined1 (*) [16])(*pauVar8 + lVar11 * 2) = auVar2;
      lVar7 = lVar7 + 2;
      puVar9 = (ulong *)((long)puVar9 + lVar17 * 2);
      pauVar8 = (undefined1 (*) [16])(*pauVar8 + lVar11 * 4);
    } while (lVar7 < lVar19);
    uVar14 = width & 7;
    uVar22 = (ulong)(iVar21 + 8);
  }
  if (3 < (int)uVar14) {
    iVar21 = (int)uVar22;
    puVar10 = (uint *)(src + iVar21);
    puVar16 = dst + iVar21;
    lVar7 = 0;
    do {
      uVar14 = *(uint *)((long)puVar10 + lVar17);
      auVar1 = vpmovzxbw_avx(ZEXT416(*puVar10));
      *(long *)puVar16 = auVar1._0_8_;
      auVar1 = vpmovzxbw_avx(ZEXT416(uVar14));
      *(long *)(puVar16 + lVar11) = auVar1._0_8_;
      lVar7 = lVar7 + 2;
      puVar10 = (uint *)((long)puVar10 + lVar17 * 2);
      puVar16 = puVar16 + lVar11 * 2;
    } while (lVar7 < lVar19);
    uVar14 = width & 3;
    uVar22 = (ulong)(iVar21 + 4);
  }
  if (uVar14 != 0) {
    uVar20 = 0;
    uVar18 = (ulong)(uint)height;
    if (height < 1) {
      uVar18 = uVar20;
    }
    for (; uVar23 = uVar22 & 0xffffffff, uVar20 != uVar18; uVar20 = uVar20 + 1) {
      for (; (long)uVar23 < (long)width; uVar23 = uVar23 + 1) {
        dst[uVar23] = (ushort)src[uVar23];
      }
      dst = dst + lVar11;
      src = src + lVar17;
    }
  }
  return;
}

Assistant:

void cdef_copy_rect8_8bit_to_16bit_avx2(uint16_t *dst, int dstride,
                                        const uint8_t *src, int sstride,
                                        int width, int height) {
  int j = 0;
  int remaining_width = width;
  assert(height % 2 == 0);
  assert(height > 0);
  assert(width > 0);

  // Process multiple 32 pixels at a time.
  if (remaining_width > 31) {
    int i = 0;
    do {
      j = 0;
      do {
        __m128i row00 =
            _mm_loadu_si128((const __m128i *)&src[(i + 0) * sstride + (j + 0)]);
        __m128i row01 = _mm_loadu_si128(
            (const __m128i *)&src[(i + 0) * sstride + (j + 16)]);
        __m128i row10 =
            _mm_loadu_si128((const __m128i *)&src[(i + 1) * sstride + (j + 0)]);
        __m128i row11 = _mm_loadu_si128(
            (const __m128i *)&src[(i + 1) * sstride + (j + 16)]);
        _mm256_storeu_si256((__m256i *)&dst[(i + 0) * dstride + (j + 0)],
                            _mm256_cvtepu8_epi16(row00));
        _mm256_storeu_si256((__m256i *)&dst[(i + 0) * dstride + (j + 16)],
                            _mm256_cvtepu8_epi16(row01));
        _mm256_storeu_si256((__m256i *)&dst[(i + 1) * dstride + (j + 0)],
                            _mm256_cvtepu8_epi16(row10));
        _mm256_storeu_si256((__m256i *)&dst[(i + 1) * dstride + (j + 16)],
                            _mm256_cvtepu8_epi16(row11));
        j += 32;
      } while (j <= width - 32);
      i += 2;
    } while (i < height);
    remaining_width = width & 31;
  }

  // Process 16 pixels at a time.
  if (remaining_width > 15) {
    int i = 0;
    do {
      __m128i row0 =
          _mm_loadu_si128((const __m128i *)&src[(i + 0) * sstride + j]);
      __m128i row1 =
          _mm_loadu_si128((const __m128i *)&src[(i + 1) * sstride + j]);
      _mm256_storeu_si256((__m256i *)&dst[(i + 0) * dstride + j],
                          _mm256_cvtepu8_epi16(row0));
      _mm256_storeu_si256((__m256i *)&dst[(i + 1) * dstride + j],
                          _mm256_cvtepu8_epi16(row1));
      i += 2;
    } while (i < height);
    remaining_width = width & 15;
    j += 16;
  }

  // Process 8 pixels at a time.
  if (remaining_width > 7) {
    int i = 0;
    do {
      __m128i row0 =
          _mm_loadl_epi64((const __m128i *)&src[(i + 0) * sstride + j]);
      __m128i row1 =
          _mm_loadl_epi64((const __m128i *)&src[(i + 1) * sstride + j]);
      _mm_storeu_si128((__m128i *)&dst[(i + 0) * dstride + j],
                       _mm_unpacklo_epi8(row0, _mm_setzero_si128()));
      _mm_storeu_si128((__m128i *)&dst[(i + 1) * dstride + j],
                       _mm_unpacklo_epi8(row1, _mm_setzero_si128()));
      i += 2;
    } while (i < height);
    remaining_width = width & 7;
    j += 8;
  }

  // Process 4 pixels at a time.
  if (remaining_width > 3) {
    int i = 0;
    do {
      __m128i row0 =
          _mm_cvtsi32_si128(*((const int32_t *)&src[(i + 0) * sstride + j]));
      __m128i row1 =
          _mm_cvtsi32_si128(*((const int32_t *)&src[(i + 1) * sstride + j]));
      _mm_storel_epi64((__m128i *)&dst[(i + 0) * dstride + j],
                       _mm_unpacklo_epi8(row0, _mm_setzero_si128()));
      _mm_storel_epi64((__m128i *)&dst[(i + 1) * dstride + j],
                       _mm_unpacklo_epi8(row1, _mm_setzero_si128()));
      i += 2;
    } while (i < height);
    remaining_width = width & 3;
    j += 4;
  }

  // Process the remaining pixels.
  if (remaining_width) {
    for (int i = 0; i < height; i++) {
      for (int k = j; k < width; k++) {
        dst[i * dstride + k] = src[i * sstride + k];
      }
    }
  }
}